

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_table_insert(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  MSize MVar3;
  jit_State *J_00;
  undefined8 *in_RSI;
  jit_State *in_RDI;
  GCtab *t;
  TRef trlen;
  RecordIndex ix;
  jit_State *in_stack_ffffffffffffff28;
  jit_State *pjVar4;
  jit_State *in_stack_ffffffffffffff38;
  lua_State *t_00;
  GCRef local_b0;
  undefined4 local_ac;
  lua_State local_a8;
  undefined8 *local_68;
  jit_State *local_60;
  int local_54;
  lua_State *local_50;
  jit_State *local_48;
  GCfunc *local_40;
  GCproto *local_38;
  undefined4 local_2c;
  GCfunc *J_01;
  
  local_a8.openupval.gcptr32 = *in_RDI->base;
  local_a8.cframe._0_4_ = in_RDI->base[1];
  in_RSI[1] = 0;
  if (((local_a8.openupval.gcptr32 & 0x1f000000) == 0xb000000) && ((TRef)local_a8.cframe != 0)) {
    if (in_RDI->base[2] != 0) {
      recff_nyiu(in_stack_ffffffffffffff28);
    }
    local_68 = in_RSI;
    local_60 = in_RDI;
    TVar1 = lj_ir_call(in_RDI,IRCALL_lj_tab_len,(ulong)local_a8.openupval.gcptr32);
    J_00 = (jit_State *)(ulong)*(uint *)*local_68;
    pjVar4 = local_60;
    TVar2 = lj_ir_kint(J_00,(int32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    (pjVar4->fold).ins.field_0.ot = 0x2813;
    (pjVar4->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (pjVar4->fold).ins.field_0.op2 = (IRRef1)TVar2;
    local_a8.env.gcptr32 = lj_opt_fold(in_stack_ffffffffffffff38);
    local_38 = (GCproto *)local_60->L;
    local_40 = (GCfunc *)&local_b0;
    local_2c = 0xfffffff4;
    local_b0.gcptr32 = (uint32_t)J_00;
    local_ac._0_1_ = 0xf4;
    local_ac._1_1_ = 0xff;
    local_ac._2_1_ = 0xff;
    local_ac._3_1_ = 0xff;
    t_00 = &local_a8;
    local_48 = J_00;
    J_01 = local_40;
    MVar3 = lj_tab_len((GCtab *)t_00);
    local_54 = MVar3 + 1;
    local_50 = t_00;
    *(double *)t_00 = (double)local_54;
    local_a8._60_4_ = 0;
    lj_record_idx((jit_State *)&J_01->c,(RecordIndex *)J_00);
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_insert(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0];
  ix.val = J->base[1];
  rd->nres = 0;
  if (tref_istab(ix.tab) && ix.val) {
    if (!J->base[2]) {  /* Simple push: t[#t+1] = v */
      TRef trlen = lj_ir_call(J, IRCALL_lj_tab_len, ix.tab);
      GCtab *t = tabV(&rd->argv[0]);
      ix.key = emitir(IRTI(IR_ADD), trlen, lj_ir_kint(J, 1));
      settabV(J->L, &ix.tabv, t);
      setintV(&ix.keyv, lj_tab_len(t) + 1);
      ix.idxchain = 0;
      lj_record_idx(J, &ix);  /* Set new value. */
    } else {  /* Complex case: insert in the middle. */
      recff_nyiu(J);
    }
  }  /* else: Interpreter will throw. */
}